

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::AddCacheEntry(cmake *this,string *key,char *value,char *helpString,int type)

{
  cmMessenger *pcVar1;
  bool bVar2;
  int iVar3;
  
  cmState::AddCacheEntry(this->State,key,value,helpString,type);
  UnwatchUnusedCli(this,key);
  iVar3 = std::__cxx11::string::compare((char *)key);
  if (iVar3 == 0) {
    pcVar1 = this->Messenger;
    if (value == (char *)0x0) {
      bVar2 = false;
    }
    else {
      bVar2 = cmSystemTools::IsOff(value);
    }
    pcVar1->SuppressDeprecatedWarnings = bVar2;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)key);
    if (iVar3 == 0) {
      pcVar1 = this->Messenger;
      bVar2 = cmSystemTools::IsOn(value);
      pcVar1->DeprecatedWarningsAsErrors = bVar2;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)key);
      if (iVar3 == 0) {
        pcVar1 = this->Messenger;
        bVar2 = cmSystemTools::IsOn(value);
        pcVar1->SuppressDevWarnings = bVar2;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)key);
        if (iVar3 == 0) {
          pcVar1 = this->Messenger;
          if (value == (char *)0x0) {
            bVar2 = false;
          }
          else {
            bVar2 = cmSystemTools::IsOff(value);
          }
          pcVar1->DevWarningsAsErrors = bVar2;
        }
      }
    }
  }
  return;
}

Assistant:

void cmake::AddCacheEntry(const std::string& key, const char* value,
                          const char* helpString, int type)
{
  this->State->AddCacheEntry(key, value, helpString,
                             cmStateEnums::CacheEntryType(type));
  this->UnwatchUnusedCli(key);

  if (key == "CMAKE_WARN_DEPRECATED") {
    this->Messenger->SetSuppressDeprecatedWarnings(
      value && cmSystemTools::IsOff(value));
  } else if (key == "CMAKE_ERROR_DEPRECATED") {
    this->Messenger->SetDeprecatedWarningsAsErrors(cmSystemTools::IsOn(value));
  } else if (key == "CMAKE_SUPPRESS_DEVELOPER_WARNINGS") {
    this->Messenger->SetSuppressDevWarnings(cmSystemTools::IsOn(value));
  } else if (key == "CMAKE_SUPPRESS_DEVELOPER_ERRORS") {
    this->Messenger->SetDevWarningsAsErrors(value &&
                                            cmSystemTools::IsOff(value));
  }
}